

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int iVar1;
  ulong *puVar2;
  bool bVar3;
  int iVar4;
  sqlite3_index_info *psVar5;
  sqlite3 *psVar6;
  WhereTerm *pWVar7;
  Bitmask in_RDX;
  WhereLoopBuilder *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  SrcItem *unaff_retaddr;
  Bitmask in_stack_00000008;
  WhereClause *in_stack_00000010;
  Bitmask mThis;
  int iTerm;
  Bitmask mNext;
  int i;
  Bitmask mBestNoIn;
  Bitmask mPrev;
  int seenZeroNoIN;
  int seenZero;
  Bitmask mBest;
  WhereLoop *pNew;
  int nConstraint;
  sqlite3_index_info *p;
  SrcItem *pSrc;
  WhereClause *pWC;
  Parse *pParse;
  WhereInfo *pWInfo;
  int rc;
  int bRetry;
  u16 mNoOmit;
  int bIn;
  undefined8 in_stack_ffffffffffffff38;
  WhereLoop *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  sqlite3 *in_stack_ffffffffffffff50;
  sqlite3 *local_a0;
  int local_94;
  sqlite3 *local_90;
  sqlite3 *local_88;
  WhereClause *pWC_00;
  u16 mNoOmit_00;
  sqlite3_index_info *pIdxInfo;
  undefined8 *puVar9;
  u16 mExclude;
  uint in_stack_ffffffffffffffc8;
  undefined4 uVar10;
  int local_18;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 uVar11;
  int iVar12;
  u16 *pmNoOmit;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  pmNoOmit = *(u16 **)(in_FS_OFFSET + 0x28);
  uVar10 = 0;
  iVar12 = -0x55555556;
  uVar11 = 0xaaaa;
  puVar9 = (undefined8 *)*in_RDI;
  pIdxInfo = (sqlite3_index_info *)*puVar9;
  pWC_00 = (WhereClause *)in_RDI[1];
  puVar2 = (ulong *)in_RDI[2];
  psVar5 = allocateIndexInfo((WhereInfo *)mThis,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                             pmNoOmit);
  if (psVar5 == (sqlite3_index_info *)0x0) {
    local_18 = 7;
  }
  else {
    *(undefined2 *)((long)puVar2 + 0x12) = 0;
    *(undefined4 *)(puVar2 + 6) = 0x400;
    *(undefined2 *)((long)puVar2 + 0x34) = 0;
    *(byte *)((long)puVar2 + 0x1c) = *(byte *)((long)puVar2 + 0x1c) & 0xfe;
    iVar1 = psVar5->nConstraint;
    iVar4 = whereLoopResize((sqlite3 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                            ,in_stack_ffffffffffffff40,iVar4);
    if (iVar4 == 0) {
      local_18 = whereLoopAddVirtualOne
                           (in_RSI,in_RDX,CONCAT44(uVar10,in_stack_ffffffffffffffc8),
                            (u16)((ulong)puVar9 >> 0x30),pIdxInfo,(u16)((ulong)pWC_00 >> 0x30),
                            (int *)CONCAT44(iVar12,CONCAT22(uVar11,in_stack_fffffffffffffff0)),
                            (int *)pmNoOmit);
      if ((local_18 == 0) &&
         ((psVar6 = (sqlite3 *)(*puVar2 & ((ulong)in_RSI ^ 0xffffffffffffffff)),
          psVar6 != (sqlite3 *)0x0 || (iVar12 != 0)))) {
        bVar8 = false;
        local_88 = (sqlite3 *)0x0;
        local_90 = (sqlite3 *)0x0;
        bVar3 = bVar8;
        if (iVar12 != 0) {
          local_18 = whereLoopAddVirtualOne
                               (in_RSI,in_RDX,(ulong)in_stack_ffffffffffffffc8,
                                (u16)((ulong)puVar9 >> 0x30),pIdxInfo,(u16)((ulong)pWC_00 >> 0x30),
                                (int *)CONCAT44(iVar12,CONCAT22(uVar11,in_stack_fffffffffffffff0)),
                                (int *)pmNoOmit);
          local_90 = (sqlite3 *)(*puVar2 & ((ulong)in_RSI ^ 0xffffffffffffffff));
          bVar8 = local_90 == (sqlite3 *)0x0;
          bVar3 = bVar8;
        }
        while (mExclude = (u16)((ulong)puVar9 >> 0x30), local_18 == 0) {
          local_a0 = (sqlite3 *)0xffffffffffffffff;
          for (local_94 = 0; mExclude = (u16)((ulong)puVar9 >> 0x30), local_94 < iVar1;
              local_94 = local_94 + 1) {
            pWVar7 = termFromWhereClause(pWC_00,psVar5->aConstraint[local_94].iTermOffset);
            in_stack_ffffffffffffff50 =
                 (sqlite3 *)(pWVar7->prereqRight & ((ulong)in_RSI ^ 0xffffffffffffffff));
            if ((local_88 < in_stack_ffffffffffffff50) && (in_stack_ffffffffffffff50 < local_a0)) {
              local_a0 = in_stack_ffffffffffffff50;
            }
          }
          local_88 = local_a0;
          if (local_a0 == (sqlite3 *)0xffffffffffffffff) break;
          if ((((local_a0 != psVar6) && (local_a0 != local_90)) &&
              (local_18 = whereLoopAddVirtualOne
                                    (in_RSI,in_RDX,CONCAT44(local_18,in_stack_ffffffffffffffc8),
                                     mExclude,pIdxInfo,(u16)((ulong)pWC_00 >> 0x30),
                                     (int *)CONCAT44(iVar12,CONCAT22(uVar11,
                                                  in_stack_fffffffffffffff0)),(int *)pmNoOmit),
              (WhereLoopBuilder *)*puVar2 == in_RSI)) && (bVar8 = true, iVar12 == 0)) {
            bVar3 = true;
          }
        }
        mNoOmit_00 = (u16)((ulong)pWC_00 >> 0x30);
        if (((local_18 == 0) && (!bVar8)) &&
           (local_18 = whereLoopAddVirtualOne
                                 (in_RSI,in_RDX,(ulong)in_stack_ffffffffffffffc8,mExclude,pIdxInfo,
                                  mNoOmit_00,
                                  (int *)CONCAT44(iVar12,CONCAT22(uVar11,in_stack_fffffffffffffff0))
                                  ,(int *)pmNoOmit), iVar12 == 0)) {
          bVar3 = true;
        }
        if ((local_18 == 0) && (!bVar3)) {
          local_18 = whereLoopAddVirtualOne
                               (in_RSI,in_RDX,(ulong)in_stack_ffffffffffffffc8,mExclude,pIdxInfo,
                                mNoOmit_00,
                                (int *)CONCAT44(iVar12,CONCAT22(uVar11,in_stack_fffffffffffffff0)),
                                (int *)pmNoOmit);
        }
      }
      freeIndexInfo(in_stack_ffffffffffffff50,
                    (sqlite3_index_info *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    else {
      freeIndexInfo(in_stack_ffffffffffffff50,
                    (sqlite3_index_info *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_18 = 7;
    }
  }
  if (*(u16 **)(in_FS_OFFSET + 0x28) == pmNoOmit) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pSTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pSTab->zName));
  WHERETRACE(0x800, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x800, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        int iTerm = p->aConstraint[i].iTermOffset;
        Bitmask mThis = termFromWhereClause(pWC, iTerm)->prereqRight & ~mPrereq;
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x800, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pSTab->zName, rc));
  return rc;
}